

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_cas_32_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint addr_in;
  uint uVar5;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar4 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  uVar1 = m68k_read_memory_16(uVar4 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar4 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  uVar2 = m68k_read_memory_16(uVar4 & m68ki_cpu.address_mask);
  addr_in = (uint)(short)uVar2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar4 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(addr_in);
  }
  uVar3 = m68k_read_memory_32(uVar4 & m68ki_cpu.address_mask);
  uVar2 = m68ki_cpu.dar[uVar1 & 7];
  uVar5 = uVar3 - uVar2;
  m68ki_cpu.n_flag = uVar5 >> 0x18;
  m68ki_cpu.v_flag = ((uVar5 ^ uVar3) & (uVar2 ^ uVar3)) >> 0x18;
  m68ki_cpu.c_flag = ((uVar5 | uVar2) & ~uVar3 | uVar5 & uVar2) >> 0x17;
  m68ki_cpu.not_z_flag = uVar3 - uVar2;
  if (m68ki_cpu.not_z_flag == 0) {
    m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
    uVar1 = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 4 & 0x1c));
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in = pmmu_translate_addr(addr_in);
    }
    m68k_write_memory_32(addr_in & m68ki_cpu.address_mask,uVar1);
    return;
  }
  m68ki_cpu.dar[uVar1 & 7] = uVar3;
  return;
}

Assistant:

static void m68k_op_cas_32_aw(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint ea = EA_AW_32();
		uint dest = m68ki_read_32(ea);
		uint* compare = &REG_D[word2 & 7];
		uint res = dest - *compare;

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_32(res);
		FLAG_Z = MASK_OUT_ABOVE_32(res);
		FLAG_V = VFLAG_SUB_32(*compare, dest, res);
		FLAG_C = CFLAG_SUB_32(*compare, dest, res);

		if(COND_NE())
			*compare = dest;
		else
		{
			USE_CYCLES(3);
			m68ki_write_32(ea, REG_D[(word2 >> 6) & 7]);
		}
		return;
	}
	m68ki_exception_illegal();
}